

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::BufferID>::emplaceRealloc<slang::BufferID>
          (SmallVectorBase<slang::BufferID> *this,pointer pos,BufferID *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pBVar4;
  long lVar5;
  pointer pBVar6;
  EVP_PKEY_CTX *ctx;
  uint32_t *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::BufferID> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  BufferID *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::BufferID> *)0xb2749b);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pBVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)pBVar4;
  pBVar6 = (pointer)operator_new(0xb274fa);
  pBVar6[lVar5 >> 2].id = *in_RDX;
  pBVar4 = end(in_RDI);
  if (in_RSI == pBVar4) {
    pBVar4 = begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::uninitialized_move<slang::BufferID*,slang::BufferID*>(in_RSI,__last,pBVar4);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<slang::BufferID*,slang::BufferID*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::uninitialized_move<slang::BufferID*,slang::BufferID*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pBVar6;
  return pBVar6 + (lVar5 >> 2);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}